

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O2

Page * __thiscall Cache<SearchBase::Page>::add(Cache<SearchBase::Page> *this,Page *data)

{
  long lVar1;
  Entry local_68;
  
  freeInvalidComments(this);
  SearchBase::Page::Page(&local_68.data,data);
  lVar1 = std::chrono::_V2::system_clock::now();
  local_68.expiration.__d.__r = (duration)((this->validityTime).__r * 1000000000 + lVar1);
  std::vector<Cache<SearchBase::Page>::Entry,_std::allocator<Cache<SearchBase::Page>::Entry>_>::
  emplace_back<Cache<SearchBase::Page>::Entry>(&this->entries,&local_68);
  SearchBase::Page::~Page(&local_68.data);
  return &(this->entries).
          super__Vector_base<Cache<SearchBase::Page>::Entry,_std::allocator<Cache<SearchBase::Page>::Entry>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].data;
}

Assistant:

T* add(T data) {
			freeInvalidComments();
			entries.push_back( { std::move(data), Clock::now() + validityTime });
			return &entries.back().data;
		}